

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_type_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *conn_00;
  connectdata *conn;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  if (ftpcode / 100 == 2) {
    if ((((ftpcode != 200) && (data != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Got a %03d response code instead of the assumed 200",(ulong)(uint)ftpcode);
    }
    if (instate == '\x13') {
      conn._4_4_ = ftp_state_size(data,conn_00);
    }
    else if (instate == '\x14') {
      conn._4_4_ = ftp_state_list(data);
    }
    else if (instate == '\x15') {
      conn._4_4_ = ftp_state_retr_prequote(data);
    }
    else if (instate == '\x16') {
      conn._4_4_ = ftp_state_stor_prequote(data);
    }
    data_local._4_4_ = conn._4_4_;
  }
  else {
    Curl_failf(data,"Couldn\'t set desired mode",(long)ftpcode % 100 & 0xffffffff);
    data_local._4_4_ = CURLE_FTP_COULDNT_SET_TYPE;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_state_type_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(data, conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(data);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(data);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(data);

  return result;
}